

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArmaturePopulate.cpp
# Opt level: O2

void Assimp::ArmaturePopulate::BuildBoneStack
               (aiNode *current_node,aiNode *root_node,aiScene *scene,
               vector<aiBone_*,_std::allocator<aiBone_*>_> *bones,
               map<aiBone_*,_aiNode_*,_std::less<aiBone_*>,_std::allocator<std::pair<aiBone_*const,_aiNode_*>_>_>
               *bone_stack,vector<aiNode_*,_std::allocator<aiNode_*>_> *node_stack)

{
  pointer ppaVar1;
  aiBone *node_name;
  pointer ppaVar2;
  aiNode *paVar3;
  Logger *pLVar4;
  pointer ppaVar5;
  char *local_1c8 [4];
  pair<aiBone_*,_aiNode_*> local_1a8 [23];
  
  if (scene == (aiScene *)0x0) {
    __assert_fail("scene",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/PostProcessing/ArmaturePopulate.cpp"
                  ,0xa9,
                  "static void Assimp::ArmaturePopulate::BuildBoneStack(aiNode *, const aiNode *, const aiScene *, const std::vector<aiBone *> &, std::map<aiBone *, aiNode *> &, std::vector<aiNode *> &)"
                 );
  }
  if (root_node == (aiNode *)0x0) {
    __assert_fail("root_node",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/PostProcessing/ArmaturePopulate.cpp"
                  ,0xaa,
                  "static void Assimp::ArmaturePopulate::BuildBoneStack(aiNode *, const aiNode *, const aiScene *, const std::vector<aiBone *> &, std::map<aiBone *, aiNode *> &, std::vector<aiNode *> &)"
                 );
  }
  if ((node_stack->super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>)._M_impl.
      super__Vector_impl_data._M_start ==
      (node_stack->super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    __assert_fail("!node_stack.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/PostProcessing/ArmaturePopulate.cpp"
                  ,0xab,
                  "static void Assimp::ArmaturePopulate::BuildBoneStack(aiNode *, const aiNode *, const aiScene *, const std::vector<aiBone *> &, std::map<aiBone *, aiNode *> &, std::vector<aiNode *> &)"
                 );
  }
  ppaVar5 = (bones->super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppaVar1 = (bones->super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  do {
    if (ppaVar5 == ppaVar1) {
      return;
    }
    node_name = *ppaVar5;
    if (node_name == (aiBone *)0x0) {
      __assert_fail("bone",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/PostProcessing/ArmaturePopulate.cpp"
                    ,0xae,
                    "static void Assimp::ArmaturePopulate::BuildBoneStack(aiNode *, const aiNode *, const aiScene *, const std::vector<aiBone *> &, std::map<aiBone *, aiNode *> &, std::vector<aiNode *> &)"
                   );
    }
    paVar3 = GetNodeFromStack(&node_name->mName,node_stack);
    if (paVar3 == (aiNode *)0x0) {
      ppaVar2 = (node_stack->super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if ((node_stack->super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>)._M_impl.
          super__Vector_impl_data._M_finish != ppaVar2) {
        (node_stack->super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>)._M_impl.
        super__Vector_impl_data._M_finish = ppaVar2;
      }
      BuildNodeList(root_node,node_stack);
      pLVar4 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[39]>
                ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                 (char (*) [39])"Resetting bone stack: nullptr element ");
      std::operator<<((ostream *)local_1a8,(node_name->mName).data);
      std::__cxx11::stringbuf::str();
      Logger::debug(pLVar4,local_1c8[0]);
      std::__cxx11::string::~string((string *)local_1c8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      paVar3 = GetNodeFromStack(&node_name->mName,node_stack);
      if (paVar3 != (aiNode *)0x0) goto LAB_003c21ad;
      pLVar4 = DefaultLogger::get();
      Logger::error(pLVar4,"serious import issue node for bone was not detected");
    }
    else {
LAB_003c21ad:
      pLVar4 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[25]>
                ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                 (char (*) [25])"Successfully added bone[");
      std::operator<<((ostream *)local_1a8,(node_name->mName).data);
      std::operator<<((ostream *)local_1a8,"] to stack and bone node is: ");
      std::operator<<((ostream *)local_1a8,(paVar3->mName).data);
      std::__cxx11::stringbuf::str();
      Logger::debug(pLVar4,local_1c8[0]);
      std::__cxx11::string::~string((string *)local_1c8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      local_1a8[0].first = node_name;
      local_1a8[0].second = paVar3;
      std::
      _Rb_tree<aiBone*,std::pair<aiBone*const,aiNode*>,std::_Select1st<std::pair<aiBone*const,aiNode*>>,std::less<aiBone*>,std::allocator<std::pair<aiBone*const,aiNode*>>>
      ::_M_emplace_unique<std::pair<aiBone*,aiNode*>>
                ((_Rb_tree<aiBone*,std::pair<aiBone*const,aiNode*>,std::_Select1st<std::pair<aiBone*const,aiNode*>>,std::less<aiBone*>,std::allocator<std::pair<aiBone*const,aiNode*>>>
                  *)bone_stack,local_1a8);
    }
    ppaVar5 = ppaVar5 + 1;
  } while( true );
}

Assistant:

void ArmaturePopulate::BuildBoneStack(aiNode *current_node,
                                      const aiNode *root_node,
                                      const aiScene *scene,
                                      const std::vector<aiBone *> &bones,
                                      std::map<aiBone *, aiNode *> &bone_stack,
                                      std::vector<aiNode *> &node_stack) {
  ai_assert(scene);
  ai_assert(root_node);
  ai_assert(!node_stack.empty());

  for (aiBone *bone : bones) {
    ai_assert(bone);
    aiNode *node = GetNodeFromStack(bone->mName, node_stack);
    if (node == nullptr) {
      node_stack.clear();
      BuildNodeList(root_node, node_stack);
      ASSIMP_LOG_DEBUG_F("Resetting bone stack: nullptr element ", bone->mName.C_Str());

      node = GetNodeFromStack(bone->mName, node_stack);

      if (!node) {
        ASSIMP_LOG_ERROR("serious import issue node for bone was not detected");
        continue;
      }
    }

    ASSIMP_LOG_DEBUG_F("Successfully added bone[", bone->mName.C_Str(), "] to stack and bone node is: ", node->mName.C_Str());

    bone_stack.insert(std::pair<aiBone *, aiNode *>(bone, node));
  }
}